

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigSavePattern3(Ivy_FraigMan_t *p)

{
  sat_solver *s;
  uint uVar1;
  int iVar2;
  int iVar3;
  Ivy_Obj_t *pObj_00;
  int local_1c;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_FraigMan_t *p_local;
  
  for (local_1c = 0; local_1c < p->nPatWords; local_1c = local_1c + 1) {
    uVar1 = Ivy_ObjRandomSim();
    p->pPatWords[local_1c] = uVar1;
  }
  for (local_1c = 0; iVar2 = Vec_PtrSize(p->vPiVars), local_1c < iVar2; local_1c = local_1c + 1) {
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vPiVars,local_1c);
    iVar2 = Ivy_InfoHasBit(p->pPatWords,pObj_00->Id + -1);
    s = p->pSat;
    iVar3 = Ivy_ObjSatNum(pObj_00);
    iVar3 = sat_solver_var_value(s,iVar3);
    if (iVar2 != iVar3) {
      Ivy_InfoXorBit(p->pPatWords,pObj_00->Id + -1);
    }
  }
  return;
}

Assistant:

void Ivy_FraigSavePattern3( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    for ( i = 0; i < p->nPatWords; i++ )
        p->pPatWords[i] = Ivy_ObjRandomSim();
    Vec_PtrForEachEntry( Ivy_Obj_t *, p->vPiVars, pObj, i )
//        if ( Ivy_InfoHasBit( p->pPatWords, pObj->Id - 1 ) ^ (p->pSat->model.ptr[Ivy_ObjSatNum(pObj)] == l_True) )
        if ( Ivy_InfoHasBit( p->pPatWords, pObj->Id - 1 ) ^ sat_solver_var_value(p->pSat, Ivy_ObjSatNum(pObj)) )
            Ivy_InfoXorBit( p->pPatWords, pObj->Id - 1 );
}